

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

int AlpnSelectCallback(SSL *ssl,uint8_t **out,uint8_t *outlen,uint8_t *in,uint inlen,void *arg)

{
  uint8_t **ssl_00;
  bool bVar1;
  byte bVar2;
  uint8_t uVar3;
  int iVar4;
  TestState *pTVar5;
  ulong uVar6;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  uint8_t *proto;
  size_t proto_len;
  uint8_t *settings;
  size_t settings_len;
  undefined8 uVar7;
  string_view s;
  byte local_b9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  undefined1 local_68 [16];
  Span<const_unsigned_char> local_58;
  TestConfig *local_48;
  TestConfig *config;
  void *arg_local;
  uint8_t *puStack_30;
  uint inlen_local;
  uint8_t *in_local;
  uint8_t *outlen_local;
  uint8_t **out_local;
  SSL *ssl_local;
  
  config = (TestConfig *)arg;
  arg_local._4_4_ = inlen;
  puStack_30 = in;
  in_local = outlen;
  outlen_local = (uint8_t *)out;
  out_local = (uint8_t **)ssl;
  pTVar5 = GetTestState(ssl);
  if ((pTVar5->alpn_select_done & 1U) != 0) {
    fprintf(_stderr,"AlpnSelectCallback called after completion.\n");
    exit(1);
  }
  pTVar5 = GetTestState((SSL *)out_local);
  pTVar5->alpn_select_done = true;
  local_48 = GetTestConfig((SSL *)out_local);
  if ((local_48->decline_alpn & 1U) == 0) {
    if ((local_48->reject_alpn & 1U) == 0) {
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        local_68 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)&local_48->expect_advertised_alpn);
        s._M_str = local_68._8_8_;
        s._M_len = (size_t)s._M_str;
        local_58 = bssl::StringAsBytes(local_68._0_8_,s);
        bssl::Span<const_unsigned_char>::Span
                  ((Span<const_unsigned_char> *)&__range2,puStack_30,(ulong)arg_local._4_4_);
        bVar1 = bssl::internal::operator!=(local_58,___range2);
        if (bVar1) {
          fprintf(_stderr,"bad ALPN select callback inputs.\n");
          exit(1);
        }
      }
      if ((local_48->defer_alps & 1U) != 0) {
        this = &local_48->application_settings;
        __end2 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin(this);
        pair = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::end(this);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end2,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      *)&pair);
          if (!bVar1) break;
          __gnu_cxx::
          __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator*(&__end2);
          ssl_00 = out_local;
          proto = (uint8_t *)std::__cxx11::string::data();
          proto_len = std::__cxx11::string::size();
          settings = (uint8_t *)std::__cxx11::string::data();
          settings_len = std::__cxx11::string::size();
          iVar4 = SSL_add_application_settings((SSL *)ssl_00,proto,proto_len,settings,settings_len);
          if (iVar4 == 0) {
            fprintf(_stderr,"error configuring ALPS.\n");
            exit(1);
          }
          __gnu_cxx::
          __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator++(&__end2);
        }
      }
      bVar2 = std::__cxx11::string::empty();
      local_b9 = 1;
      if ((bVar2 & 1) == 0) {
        local_b9 = local_48->select_empty_alpn ^ 0xff;
      }
      if ((local_b9 & 1) == 0) {
        __assert_fail("config->select_alpn.empty() || !config->select_empty_alpn",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/test_config.cc"
                      ,0x428,
                      "int AlpnSelectCallback(SSL *, const uint8_t **, uint8_t *, const uint8_t *, unsigned int, void *)"
                     );
      }
      uVar7 = std::__cxx11::string::data();
      *(undefined8 *)outlen_local = uVar7;
      uVar3 = std::__cxx11::string::size();
      *in_local = uVar3;
      ssl_local._4_4_ = 0;
    }
    else {
      ssl_local._4_4_ = 2;
    }
  }
  else {
    ssl_local._4_4_ = 3;
  }
  return ssl_local._4_4_;
}

Assistant:

static int AlpnSelectCallback(SSL *ssl, const uint8_t **out, uint8_t *outlen,
                              const uint8_t *in, unsigned inlen, void *arg) {
  if (GetTestState(ssl)->alpn_select_done) {
    fprintf(stderr, "AlpnSelectCallback called after completion.\n");
    exit(1);
  }

  GetTestState(ssl)->alpn_select_done = true;

  const TestConfig *config = GetTestConfig(ssl);
  if (config->decline_alpn) {
    return SSL_TLSEXT_ERR_NOACK;
  }
  if (config->reject_alpn) {
    return SSL_TLSEXT_ERR_ALERT_FATAL;
  }

  if (!config->expect_advertised_alpn.empty() &&
      bssl::StringAsBytes(config->expect_advertised_alpn) !=
          bssl::Span(in, inlen)) {
    fprintf(stderr, "bad ALPN select callback inputs.\n");
    exit(1);
  }

  if (config->defer_alps) {
    for (const auto &pair : config->application_settings) {
      if (!SSL_add_application_settings(
              ssl, reinterpret_cast<const uint8_t *>(pair.first.data()),
              pair.first.size(),
              reinterpret_cast<const uint8_t *>(pair.second.data()),
              pair.second.size())) {
        fprintf(stderr, "error configuring ALPS.\n");
        exit(1);
      }
    }
  }

  assert(config->select_alpn.empty() || !config->select_empty_alpn);
  *out = (const uint8_t *)config->select_alpn.data();
  *outlen = config->select_alpn.size();
  return SSL_TLSEXT_ERR_OK;
}